

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

int mu_button_ex(mu_Context *ctx,char *label,int icon,int opt)

{
  size_t sVar1;
  mu_Rect rect;
  mu_Id local_3c;
  mu_Rect r;
  mu_Id id;
  int res;
  int opt_local;
  int icon_local;
  char *label_local;
  mu_Context *ctx_local;
  
  r.h = 0;
  res = icon;
  _opt_local = label;
  label_local = (char *)ctx;
  if (label == (char *)0x0) {
    local_3c = mu_get_id(ctx,&res,4);
  }
  else {
    sVar1 = strlen(label);
    local_3c = mu_get_id(ctx,label,(int)sVar1);
  }
  rect = mu_layout_next((mu_Context *)label_local);
  mu_update_control((mu_Context *)label_local,local_3c,rect,opt);
  if ((*(int *)(label_local + 0x41f4c) == 1) && (*(mu_Id *)(label_local + 0x84) == local_3c)) {
    r.h = 2;
  }
  mu_draw_control_frame((mu_Context *)label_local,local_3c,rect,6,opt);
  if (_opt_local != (char *)0x0) {
    mu_draw_control_text((mu_Context *)label_local,_opt_local,rect,0,opt);
  }
  if (res != 0) {
    mu_draw_icon((mu_Context *)label_local,res,rect,
                 *(mu_Color *)(*(long *)(label_local + 0x78) + 0x28));
  }
  return r.h;
}

Assistant:

int mu_button_ex(mu_Context *ctx, const char *label, int icon, int opt) {
  int res = 0;
  mu_Id id = label ? mu_get_id(ctx, label, strlen(label))
                   : mu_get_id(ctx, &icon, sizeof(icon));
  mu_Rect r = mu_layout_next(ctx);
  mu_update_control(ctx, id, r, opt);
  /* handle click */
  if (ctx->mouse_pressed == MU_MOUSE_LEFT && ctx->focus == id) {
    res |= MU_RES_SUBMIT;
  }
  /* draw */
  mu_draw_control_frame(ctx, id, r, MU_COLOR_BUTTON, opt);
  if (label) { mu_draw_control_text(ctx, label, r, MU_COLOR_TEXT, opt); }
  if (icon) { mu_draw_icon(ctx, icon, r, ctx->style->colors[MU_COLOR_TEXT]); }
  return res;
}